

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogComboBox::setHistory(QFileDialogComboBox *this,QStringList *paths)

{
  QFileSystemModel *pQVar1;
  char cVar2;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QUrl url;
  undefined1 *local_88;
  undefined1 *puStack_80;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_78;
  QArrayDataPointer<QUrl> local_68;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<QString>::operator=(&(this->m_history).d,&paths->d);
  local_68.size = 0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (QUrl *)0x0;
  local_78.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this->d_ptr->model;
  QFileDialogPrivate::rootPath((QString *)&local_50,this->d_ptr);
  QFileSystemModel::index((QString *)&local_88,(int)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
  url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  if ((((int)local_88 < 0) || ((long)local_88 < 0)) || (local_78.ptr == (QAbstractItemModel *)0x0))
  {
    latin1.m_data = "file:";
    latin1.m_size = 5;
    QString::QString((QString *)&local_50,latin1);
    QUrl::QUrl(&url,(QString *)&local_50,TolerantMode);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
  }
  else {
    QModelIndex::data(&local_50,(QModelIndex *)&local_88,0x101);
    ::QVariant::toString();
    QDir::toNativeSeparators((QString *)&local_a8);
    QUrl::fromLocalFile((QString *)&url);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    ::QVariant::~QVariant(&local_50);
  }
  cVar2 = QUrl::isValid();
  if (cVar2 != '\0') {
    QList<QUrl>::emplaceBack<QUrl_const&>((QList<QUrl> *)&local_68,&url);
  }
  QUrlModel::setUrls(this->urlModel,(QList<QUrl> *)&local_68);
  QUrl::~QUrl(&url);
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogComboBox::setHistory(const QStringList &paths)
{
    m_history = paths;
    // Only populate the first item, showPopup will populate the rest if needed
    QList<QUrl> list;
    const QModelIndex idx = d_ptr->model->index(d_ptr->rootPath());
    //On windows the popup display the "C:\", convert to nativeSeparators
    const QUrl url = idx.isValid()
                   ? QUrl::fromLocalFile(QDir::toNativeSeparators(idx.data(QFileSystemModel::FilePathRole).toString()))
                   : QUrl("file:"_L1);
    if (url.isValid())
        list.append(url);
    urlModel->setUrls(list);
}